

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool __thiscall
IR::MultiBranchInstr::ReplaceTarget
          (MultiBranchInstr *this,LabelInstr *oldLabelInstr,LabelInstr *newLabelInstr)

{
  Kind KVar1;
  long *plVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  void **value;
  long lVar7;
  ulong uVar8;
  int iVar9;
  anon_class_32_1_3fcf6586_for_fn local_78;
  anon_class_32_1_3fcf6586_for_fn local_58;
  bool local_31 [8];
  bool remapped;
  
  bVar4 = BranchInstr::IsMultiBranch(&this->super_BranchInstr);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x6ee,"(this->IsMultiBranch())","this->IsMultiBranch()");
    if (!bVar4) goto LAB_0048237f;
    *puVar5 = 0;
  }
  local_58.fn.remapped = local_31;
  local_31[0] = false;
  plVar2 = (long *)this->m_branchTargets;
  if (plVar2 == (long *)0x0) {
    local_31[0] = false;
  }
  else {
    KVar1 = this->m_kind;
    local_58.fn.oldLabelInstr = oldLabelInstr;
    local_58.fn.this = this;
    local_58.fn.newLabelInstr = newLabelInstr;
    if ((KVar1 == IntJumpTable) || (KVar1 == SingleCharStrJumpTable)) {
      lVar6 = this->m_baseCaseValue;
      lVar7 = lVar6 * 8 + *plVar2;
      for (; lVar6 <= this->m_lastCaseValue; lVar6 = lVar6 + 1) {
        anon_func::anon_class_32_1_3fcf6586::anon_class_32_1_3fcf6586_for_fn::
        anon_class_32_1_3fcf6586_for_fn::anon_class_32_1_3fcf6586_for_fn::operator()
                  (&local_58,(void **)(lVar7 + this->m_baseCaseValue * -8));
        lVar7 = lVar7 + 8;
      }
      value = (void **)(plVar2 + 1);
    }
    else if (KVar1 == StrDictionary) {
      local_78.fn.remapped = local_58.fn.remapped;
      local_78.fn.oldLabelInstr = oldLabelInstr;
      local_78.fn.this = this;
      local_78.fn.newLabelInstr = newLabelInstr;
      for (uVar8 = 0; uVar8 < *(uint *)((long)plVar2 + 0x1c); uVar8 = uVar8 + 1) {
        iVar9 = *(int *)(*plVar2 + uVar8 * 4);
        if (iVar9 != -1) {
          while (iVar9 != -1) {
            lVar6 = (long)iVar9;
            iVar9 = *(int *)(plVar2[1] + 8 + lVar6 * 0x18);
            anon_func::anon_class_32_1_3fcf6586::anon_class_32_1_3fcf6586_for_fn::
            anon_class_32_1_3fcf6586_for_fn::anon_class_32_1_3fcf6586_for_fn::operator()
                      (&local_78,(void **)(plVar2[1] + lVar6 * 0x18));
          }
        }
      }
      value = (void **)(plVar2 + 7);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                         ,0x435,"(false)","false");
      if (!bVar4) {
LAB_0048237f:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
      value = (void **)0x0;
    }
    anon_func::anon_class_32_1_3fcf6586::anon_class_32_1_3fcf6586_for_fn::
    anon_class_32_1_3fcf6586_for_fn::anon_class_32_1_3fcf6586_for_fn::operator()(&local_58,value);
  }
  return (bool)(local_31[0] & 1);
}

Assistant:

bool
MultiBranchInstr::ReplaceTarget(IR::LabelInstr * oldLabelInstr, IR::LabelInstr * newLabelInstr)
{
    Assert(this->IsMultiBranch());
    bool remapped = false;
    this->UpdateMultiBrLabels([=, &remapped](IR::LabelInstr * targetLabel) -> IR::LabelInstr *
    {
        if (targetLabel == oldLabelInstr)
        {
            this->ChangeLabelRef(targetLabel, newLabelInstr);
            remapped = true;
            return newLabelInstr;
        }
        return targetLabel;
    });
    return remapped;
}